

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

int __thiscall helics::FederateState::checkInterfaces(FederateState *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer ppVar4;
  string_view fmt;
  string_view logMessageSource;
  string_view fmt_00;
  string_view logMessageSource_00;
  format_args args;
  string_view message;
  format_args args_00;
  string_view message_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_98;
  size_t local_90;
  pointer local_88;
  size_type sStack_80;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  issues;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_58;
  size_t sStack_50;
  
  InterfaceInfo::checkInterfacesForIssues_abi_cxx11_(&issues,&this->interfaceInformation);
  if (issues.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      issues.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0;
  }
  else {
    this->errorCode =
         (issues.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->first;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->errorString,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(issues.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second);
    for (ppVar4 = issues.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length,
        _Var1._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
        ppVar4 != issues.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
      if (ppVar4->first == -2) {
        local_58 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                   (ppVar4->second)._M_dataplus._M_p;
        sStack_50 = (ppVar4->second)._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x14;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v11::vformat_abi_cxx11_((string *)&local_98,(v11 *)"Connection Error: {}",fmt,args);
        in_R9._4_4_ = local_98._4_4_;
        in_R9._0_4_ = local_98._0_4_;
        logMessageSource._M_str = _Var1._M_p;
        logMessageSource._M_len = sVar2;
        message._M_str = (char *)in_R9.values_;
        message._M_len = local_90;
        logMessage(this,0,logMessageSource,message,false);
        this_00 = &local_98;
      }
      else {
        local_88 = (ppVar4->second)._M_dataplus._M_p;
        sStack_80 = (ppVar4->second)._M_string_length;
        fmt_00.size_ = 0xd1;
        fmt_00.data_ = (char *)0x11;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_98;
        local_98._0_4_ = ppVar4->first;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&local_58,(v11 *)"error code {}: {}",fmt_00,args_00);
        logMessageSource_00._M_str = _Var1._M_p;
        logMessageSource_00._M_len = sVar2;
        message_00._M_str = (char *)local_58.values_;
        message_00._M_len = sStack_50;
        in_R9 = local_58;
        logMessage(this,0,logMessageSource_00,message_00,false);
        this_00 = &local_58;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    iVar3 = this->errorCode;
  }
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&issues);
  return iVar3;
}

Assistant:

int FederateState::checkInterfaces()
{
    auto issues = interfaceInformation.checkInterfacesForIssues();
    if (issues.empty()) {
        return 0;
    }
    errorCode = issues.front().first;
    errorString = issues.front().second;
    for (auto& issue : issues) {
        switch (issue.first) {
            case defs::Errors::CONNECTION_FAILURE:
                LOG_ERROR(fmt::format("Connection Error: {}", issue.second));
                break;
            default:
                LOG_ERROR(fmt::format("error code {}: {}", issue.first, issue.second));
                break;
        }
    }
    return errorCode;
}